

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O3

void Ptex::v2_2::(anonymous_namespace)::ApplyS<unsigned_short,3>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int nTxChan)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint *puVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  
  iVar6 = k->v1;
  iVar5 = k->v2;
  if (iVar6 != iVar5) {
    fVar1 = k->A;
    iVar9 = -iVar6;
    do {
      iVar2 = k->rowlen;
      iVar3 = k->u1;
      iVar8 = (iVar2 - iVar6) - k->w2;
      if (iVar8 < iVar3) {
        iVar8 = iVar3;
      }
      iVar7 = (iVar2 - iVar6) - k->w1;
      if (k->u2 < iVar7) {
        iVar7 = k->u2;
      }
      iVar7 = (iVar7 - iVar8) * nTxChan;
      if (0 < iVar7) {
        fVar13 = (float)iVar8 - k->u;
        fVar12 = (float)iVar6 - k->v;
        fVar14 = fVar13 * k->A * fVar13 + (k->B * fVar13 + k->C * fVar12) * fVar12;
        fVar12 = (fVar13 + fVar13 + 1.0) * k->A + fVar12 * k->B;
        iVar5 = (iVar2 + iVar9) - k->w2;
        if (iVar5 < iVar3) {
          iVar5 = iVar3;
        }
        puVar10 = (uint *)((long)data + (long)((iVar5 + iVar2 * iVar6) * nTxChan) * 2);
        do {
          if (fVar14 < 1.0) {
            fVar13 = expf(fVar14 * -6.125);
            fVar13 = fVar13 * k->wscale;
            k->weight = k->weight + fVar13;
            uVar4 = *puVar10;
            auVar11._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
            auVar11._4_2_ = (short)(uVar4 >> 0x10);
            auVar11._0_4_ = uVar4;
            *(ulong *)result =
                 CONCAT44(fVar13 * (float)auVar11._4_4_ +
                          (float)((ulong)*(undefined8 *)result >> 0x20),
                          fVar13 * (float)(uVar4 & 0xffff) + (float)*(undefined8 *)result);
            result[2] = (float)(ushort)puVar10[1] * fVar13 + result[2];
          }
          fVar14 = fVar14 + fVar12;
          fVar12 = fVar12 + fVar1 + fVar1;
          puVar10 = (uint *)((long)puVar10 + (long)nTxChan * 2);
        } while (puVar10 < (uint *)((long)data +
                                   (long)iVar7 * 2 + (long)((iVar8 + iVar2 * iVar6) * nTxChan) * 2))
        ;
        iVar5 = k->v2;
      }
      iVar6 = iVar6 + 1;
      iVar9 = iVar9 + -1;
    } while (iVar6 != iVar5);
  }
  return;
}

Assistant:

void ApplyS(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int nTxChan)
    {
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }